

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawBrandedSchema * __thiscall capnp::SchemaLoader::Impl::getUnbound(Impl *this,RawSchema *schema)

{
  RawBrandedSchema *pRVar1;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar2;
  StructReader local_80;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_50;
  PointerReader local_38;
  
  local_38.pointer = (WirePointer *)schema->encodedNode;
  local_38.segment = (SegmentReader *)0x0;
  local_38.capTable = (CapTableReader *)0x0;
  local_38.nestingLimit = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_80,&local_38,(word *)0x0);
  if ((local_80.dataSize < 0x121) || ((*(byte *)((long)local_80.data + 0x24) & 1) == 0)) {
    pRVar1 = &schema->defaultBrand;
  }
  else {
    kj::
    Table<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>>
    ::find<0ul,capnp::_::RawSchema_const*&>
              ((Table<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::_::RawSchema_const*,capnp::_::RawBrandedSchema*>::Callbacks>>
                *)&local_80,(RawSchema **)&this->unboundBrands);
    if (local_80.segment == (SegmentReader *)0x0) {
      pRVar1 = (RawBrandedSchema *)kj::Arena::allocateBytes(&this->arena,0x28,8,false);
      pRVar1->scopes = (Scope *)0x0;
      pRVar1->dependencies = (Dependency *)0x0;
      pRVar1->scopeCount = 0;
      pRVar1->dependencyCount = 0;
      pRVar1->lazyInitializer = (Initializer *)0x0;
      pRVar1->generic = schema;
      local_50.ptr.isSet = false;
      AVar2 = makeBrandedDependencies(this,schema,&local_50);
      pRVar1->dependencies = AVar2.ptr;
      pRVar1->dependencyCount = (uint32_t)AVar2.size_;
      local_80.segment = (SegmentReader *)schema;
      local_80.capTable = (CapTableReader *)pRVar1;
      kj::
      Table<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Entry,_kj::HashIndex<kj::HashMap<const_capnp::_::RawSchema_*,_capnp::_::RawBrandedSchema_*>::Callbacks>_>
      ::insert(&(this->unboundBrands).table,(Entry *)&local_80);
    }
    else {
      pRVar1 = *(RawBrandedSchema **)&(local_80.segment)->id;
    }
  }
  return pRVar1;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::getUnbound(const _::RawSchema* schema) {
  if (!readMessageUnchecked<schema::Node>(schema->encodedNode).getIsGeneric()) {
    // Not a generic type, so just return the default brand.
    return &schema->defaultBrand;
  }

  KJ_IF_SOME(existing, unboundBrands.find(schema)) {
    return existing;
  } else {
    auto slot = &arena.allocate<_::RawBrandedSchema>();
    memset(slot, 0, sizeof(*slot));
    slot->generic = schema;
    auto deps = makeBrandedDependencies(schema, kj::none);
    slot->dependencies = deps.begin();
    slot->dependencyCount = deps.size();
    unboundBrands.insert(schema, slot);
    return slot;
  }